

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall soplex::Array<double>::Array(Array<double> *this,Array<double> *old)

{
  vector<double,_std::allocator<double>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2bf10c);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

Array(const Array& old)
   {
      data = old.data;
   }